

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

void wp_token_consume_decimal_digits(w_tokenizer *tokenizer)

{
  char *pcVar1;
  uint32_t uVar2;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_consume_decimal_digits",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xbf);
  }
  pcVar1 = tokenizer->it;
  if (pcVar1 == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_consume_decimal_digits",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xc0);
    pcVar1 = tokenizer->it;
  }
  if ((byte)(*pcVar1 - 0x30U) < 10) {
    uVar2 = tokenizer->column;
    do {
      uVar2 = uVar2 + 1;
      pcVar1 = pcVar1 + 1;
      tokenizer->it = pcVar1;
      tokenizer->column = uVar2;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
  }
  return;
}

Assistant:

static void
wp_token_consume_decimal_digits(
    struct w_tokenizer *tokenizer
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);

    while (*tokenizer->it >= '0' && *tokenizer->it <= '9')
    {
        wp_token_advance_iter(tokenizer);
    }
}